

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fission.cpp
# Opt level: O3

Loop * __thiscall spvtools::opt::LoopFissionImpl::SplitLoop(LoopFissionImpl *this)

{
  _Rb_tree_header *p_Var1;
  IRContext *this_00;
  mapped_type pIVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  Loop *pLVar5;
  undefined8 *puVar6;
  Function *pFVar7;
  byte bVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  Loop *pLVar11;
  BasicBlock *pBVar12;
  _Hash_node_base *p_Var13;
  _Base_ptr p_Var14;
  mapped_type *pmVar15;
  IRContext *pIVar16;
  mapped_type *ppIVar17;
  _Base_ptr p_Var18;
  _Base_ptr p_Var19;
  _Rb_tree_header *p_Var20;
  Instruction *inst;
  Instruction *pIVar21;
  Instruction *inst_1;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> UVar22;
  LoopUtils util;
  LoopCloningResult clone_results;
  Instruction *local_190;
  Loop *local_188;
  IRContext *local_180;
  undefined8 *local_178;
  undefined8 *puStack_170;
  long local_168;
  _Rb_tree_header *local_158;
  _Hash_node_base *local_150;
  LoopUtils local_148;
  undefined1 local_128 [56];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_f0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_b8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_80;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  local_48;
  
  local_148.context_ = this->context_;
  pLVar11 = this->loop_;
  local_148.loop_desc_ =
       IRContext::GetLoopDescriptor(local_148.context_,pLVar11->loop_header_->function_);
  local_148.function_ = pLVar11->loop_header_->function_;
  local_128._0_8_ = local_128 + 0x30;
  local_128._8_8_ = 1;
  local_128._16_8_ = (_Hash_node_base *)0x0;
  local_128._24_8_ = 0;
  local_128._32_4_ = 1.0;
  local_128._40_8_ = 0;
  local_128._48_8_ = (__node_base_ptr)0x0;
  local_f0._M_buckets = (__buckets_ptr)(local_128 + 0x68);
  local_f0._M_bucket_count = 1;
  local_f0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_f0._M_element_count = 0;
  local_f0._M_rehash_policy._M_max_load_factor = 1.0;
  local_f0._M_rehash_policy._M_next_resize = 0;
  local_f0._M_single_bucket = (__node_base_ptr)0x0;
  local_b8._M_buckets = (__buckets_ptr)(local_128 + 0xa0);
  local_b8._M_bucket_count = 1;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8._M_element_count = 0;
  local_b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8._M_rehash_policy._M_next_resize = 0;
  local_b8._M_single_bucket = (__node_base_ptr)0x0;
  local_80._M_buckets = (__buckets_ptr)(local_128 + 0xd8);
  local_80._M_bucket_count = 1;
  local_80._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_80._M_element_count = 0;
  local_80._M_rehash_policy._M_max_load_factor = 1.0;
  local_48.
  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80._M_rehash_policy._M_next_resize = 0;
  local_80._M_single_bucket = (__node_base_ptr)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.loop_ = pLVar11;
  pLVar11 = LoopUtils::CloneAndAttachLoopToHeader(&local_148,(LoopCloningResult *)local_128);
  Loop::UpdateLoopMergeInst(pLVar11);
  pFVar7 = local_148.function_;
  pBVar12 = Loop::GetOrCreatePreHeaderBlock(this->loop_);
  pIVar21 = (pBVar12->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar9 = 0;
  if (pIVar21->has_result_id_ == true) {
    uVar9 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
  }
  UVar22 = std::
           __find_if<spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>,__gnu_cxx::__ops::_Iter_pred<spvtools::opt::Function::FindBlock(unsigned_int)::_lambda(spvtools::opt::BasicBlock_const&)_1_>>
                     (&pFVar7->blocks_,
                      (pFVar7->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,&pFVar7->blocks_,
                      (pFVar7->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,uVar9);
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
  ::
  _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>*,std::vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>>>>
            ((vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
              *)&(local_148.function_)->blocks_,UVar22.iterator_._M_current._M_current + 1,
             local_48.
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_48.
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  local_188 = pLVar11;
  Loop::SetPreHeaderBlock(this->loop_,pLVar11->loop_merge_);
  local_178 = (undefined8 *)0x0;
  puStack_170 = (undefined8 *)0x0;
  local_168 = 0;
  p_Var13 = (this->loop_->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
  if (p_Var13 != (_Hash_node_base *)0x0) {
    p_Var1 = &(this->cloned_loop_instructions_)._M_t._M_impl.super__Rb_tree_header;
    p_Var20 = &(this->original_loop_instructions_)._M_t._M_impl.super__Rb_tree_header;
    local_158 = p_Var20;
    do {
      uVar9 = *(uint32_t *)&p_Var13[1]._M_nxt;
      pIVar16 = this->context_;
      local_150 = p_Var13;
      if ((pIVar16->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(pIVar16);
      }
      pBVar12 = CFG::block((pIVar16->cfg_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                           .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,uVar9);
      for (pIVar21 = (pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                     super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
          pIVar21 != &(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
          pIVar21 = (pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        p_Var14 = (this->cloned_loop_instructions_)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent;
        p_Var18 = &p_Var1->_M_header;
        if (p_Var14 != (_Base_ptr)0x0) {
          do {
            if (*(Instruction **)(p_Var14 + 1) >= pIVar21) {
              p_Var18 = p_Var14;
            }
            p_Var14 = (&p_Var14->_M_left)[*(Instruction **)(p_Var14 + 1) < pIVar21];
          } while (p_Var14 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var18 != p_Var1) &&
             ((Instruction *)((_Rb_tree_header *)p_Var18)->_M_node_count <= pIVar21)) {
            p_Var14 = (this->original_loop_instructions_)._M_t._M_impl.super__Rb_tree_header.
                      _M_header._M_parent;
            p_Var18 = &p_Var20->_M_header;
            if (p_Var14 != (_Base_ptr)0x0) {
              do {
                if (*(Instruction **)(p_Var14 + 1) >= pIVar21) {
                  p_Var18 = p_Var14;
                }
                p_Var14 = (&p_Var14->_M_left)[*(Instruction **)(p_Var14 + 1) < pIVar21];
              } while (p_Var14 != (_Base_ptr)0x0);
              if (((_Rb_tree_header *)p_Var18 != p_Var20) &&
                 ((Instruction *)((_Rb_tree_header *)p_Var18)->_M_node_count <= pIVar21))
              goto LAB_00244e44;
            }
            local_190 = pIVar21;
            std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
            emplace_back<spvtools::opt::Instruction*>
                      ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                        *)&local_178,&local_190);
            if (pIVar21->opcode_ == OpPhi) {
              local_180 = this->context_;
              bVar8 = pIVar21->has_result_id_;
              uVar10 = 0;
              uVar9 = 0;
              if ((bool)bVar8 == true) {
                uVar9 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
                bVar8 = pIVar21->has_result_id_;
              }
              if ((bVar8 & 1) != 0) {
                uVar10 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
              }
              local_190 = (Instruction *)CONCAT44(local_190._4_4_,uVar10);
              pmVar15 = std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)(local_128 + 0x38),(key_type *)&local_190);
              IRContext::ReplaceAllUsesWith(local_180,uVar9,*pmVar15);
              p_Var20 = local_158;
            }
          }
        }
LAB_00244e44:
      }
      p_Var13 = local_150->_M_nxt;
    } while (p_Var13 != (_Hash_node_base *)0x0);
  }
  pIVar16 = (IRContext *)(local_188->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
  pLVar11 = local_188;
  puVar3 = local_178;
  puVar4 = puStack_170;
  if (pIVar16 != (IRContext *)0x0) {
    p_Var1 = &(this->cloned_loop_instructions_)._M_t._M_impl.super__Rb_tree_header;
    p_Var20 = &(this->original_loop_instructions_)._M_t._M_impl.super__Rb_tree_header;
    do {
      uVar9 = (pIVar16->grammar_).target_env_;
      this_00 = this->context_;
      local_180 = pIVar16;
      if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(this_00);
      }
      pBVar12 = CFG::block((this_00->cfg_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                           .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,uVar9);
      for (pIVar21 = (pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                     super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
          pIVar21 != &(pBVar12->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
          pIVar21 = (pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        local_190 = pIVar21;
        ppIVar17 = std::__detail::
                   _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)local_128,&local_190);
        pIVar2 = *ppIVar17;
        p_Var14 = (this->cloned_loop_instructions_)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent;
        p_Var19 = &p_Var1->_M_header;
        p_Var18 = &p_Var20->_M_header;
        if (p_Var14 == (_Base_ptr)0x0) {
LAB_00244f17:
          p_Var14 = (this->original_loop_instructions_)._M_t._M_impl.super__Rb_tree_header._M_header
                    ._M_parent;
          if (p_Var14 != (_Base_ptr)0x0) {
LAB_00244f23:
            do {
              if (*(mapped_type *)(p_Var14 + 1) >= pIVar2) {
                p_Var18 = p_Var14;
              }
              p_Var14 = (&p_Var14->_M_left)[*(mapped_type *)(p_Var14 + 1) < pIVar2];
            } while (p_Var14 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var18 != p_Var20) &&
               ((mapped_type)((_Rb_tree_header *)p_Var18)->_M_node_count <= pIVar2)) {
              local_190 = pIVar21;
              std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
              emplace_back<spvtools::opt::Instruction*>
                        ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                          *)&local_178,&local_190);
            }
          }
        }
        else {
          do {
            if (*(mapped_type *)(p_Var14 + 1) >= pIVar2) {
              p_Var19 = p_Var14;
            }
            p_Var14 = (&p_Var14->_M_left)[*(mapped_type *)(p_Var14 + 1) < pIVar2];
          } while (p_Var14 != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var19 == p_Var1) goto LAB_00244f17;
          p_Var14 = (this->original_loop_instructions_)._M_t._M_impl.super__Rb_tree_header._M_header
                    ._M_parent;
          if (p_Var14 != (_Base_ptr)0x0 &&
              pIVar2 < (mapped_type)((_Rb_tree_header *)p_Var19)->_M_node_count) goto LAB_00244f23;
        }
      }
      pIVar16 = (IRContext *)local_180->syntax_context_;
      pLVar11 = local_188;
      puVar3 = local_178;
      puVar4 = puStack_170;
    } while (pIVar16 != (IRContext *)0x0);
  }
  for (; puVar6 = puStack_170, pLVar5 = local_188, local_188 = pLVar11, puVar3 != puStack_170;
      puVar3 = puVar3 + 1) {
    puStack_170 = puVar4;
    IRContext::KillInst(this->context_,(Instruction *)*puVar3);
    pLVar11 = local_188;
    puVar4 = puStack_170;
    puStack_170 = puVar6;
    local_188 = pLVar5;
  }
  puStack_170 = puVar4;
  if (local_178 != (undefined8 *)0x0) {
    operator_delete(local_178,local_168 - (long)local_178);
  }
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ::~vector((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             *)(local_128 + 0xe0));
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_128 + 0xa8));
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_128 + 0x70));
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_128 + 0x38));
  std::
  _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_128);
  return pLVar5;
}

Assistant:

Loop* LoopFissionImpl::SplitLoop() {
  // Clone the loop.
  LoopUtils util{context_, loop_};
  LoopUtils::LoopCloningResult clone_results;
  Loop* cloned_loop = util.CloneAndAttachLoopToHeader(&clone_results);

  // Update the OpLoopMerge in the cloned loop.
  cloned_loop->UpdateLoopMergeInst();

  // Add the loop_ to the module.
  // TODO(1841): Handle failure to create pre-header.
  Function::iterator it =
      util.GetFunction()->FindBlock(loop_->GetOrCreatePreHeaderBlock()->id());
  util.GetFunction()->AddBasicBlocks(clone_results.cloned_bb_.begin(),
                                     clone_results.cloned_bb_.end(), ++it);
  loop_->SetPreHeaderBlock(cloned_loop->GetMergeBlock());

  std::vector<Instruction*> instructions_to_kill{};

  // Kill all the instructions which should appear in the cloned loop but not in
  // the original loop.
  for (uint32_t id : loop_->GetBlocks()) {
    BasicBlock* block = context_->cfg()->block(id);

    for (Instruction& inst : *block) {
      // If the instruction appears in the cloned loop instruction group, kill
      // it.
      if (cloned_loop_instructions_.count(&inst) == 1 &&
          original_loop_instructions_.count(&inst) == 0) {
        instructions_to_kill.push_back(&inst);
        if (inst.opcode() == spv::Op::OpPhi) {
          context_->ReplaceAllUsesWith(
              inst.result_id(), clone_results.value_map_[inst.result_id()]);
        }
      }
    }
  }

  // Kill all instructions which should appear in the original loop and not in
  // the cloned loop.
  for (uint32_t id : cloned_loop->GetBlocks()) {
    BasicBlock* block = context_->cfg()->block(id);
    for (Instruction& inst : *block) {
      Instruction* old_inst = clone_results.ptr_map_[&inst];
      // If the instruction belongs to the original loop instruction group, kill
      // it.
      if (cloned_loop_instructions_.count(old_inst) == 0 &&
          original_loop_instructions_.count(old_inst) == 1) {
        instructions_to_kill.push_back(&inst);
      }
    }
  }

  for (Instruction* i : instructions_to_kill) {
    context_->KillInst(i);
  }

  return cloned_loop;
}